

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

Handle __thiscall
async_simple::coro::detail::
LazyBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>,_false>::AwaiterBase::
awaitSuspendImpl(AwaiterBase *this)

{
  AwaiterBase *this_local;
  
  return (Handle)(this->
                 super_LazyAwaiterBase<async_simple::Try<std::pair<std::error_code,_unsigned_long>_>_>
                 )._handle.__handle_;
}

Assistant:

auto awaitSuspendImpl() noexcept(!reschedule) {
            if constexpr (reschedule) {
                // executor schedule performed
                auto& pr = this->_handle.promise();
                logicAssert(pr._executor, "RescheduleLazy need executor");
                pr._executor->schedule(this->_handle);
            } else {
                return this->_handle;
            }
        }